

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_getdate(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  int iValue;
  int iValue_00;
  int iValue_01;
  int iVar2;
  int iValue_02;
  int iValue_03;
  ulong uVar3;
  tm *ptVar4;
  jx9_value *pVal;
  jx9_value *pArray;
  time_t iValue_04;
  time_t t;
  ulong local_40;
  jx9_context *local_38;
  
  if (nArg < 1) {
    time(&t);
  }
  else {
    if (((*apArg)->iFlags & 2) != 0) {
      t = jx9_value_to_int64(*apArg);
      ptVar4 = localtime(&t);
      if (ptVar4 != (tm *)0x0) goto LAB_0012decc;
    }
    time(&t);
  }
LAB_0012decc:
  ptVar4 = localtime(&t);
  iVar1 = ptVar4->tm_hour;
  iValue = ptVar4->tm_sec;
  iValue_00 = ptVar4->tm_min;
  local_40 = (ulong)(uint)ptVar4->tm_mon;
  iValue_01 = ptVar4->tm_mday;
  iVar2 = ptVar4->tm_year;
  iValue_02 = ptVar4->tm_yday;
  iValue_03 = ptVar4->tm_wday;
  pVal = jx9_context_new_scalar(pCtx);
  if ((pVal == (jx9_value *)0x0) ||
     (pArray = jx9_context_new_array(pCtx), pArray == (jx9_value *)0x0)) {
    jx9_result_null(pCtx);
  }
  else {
    local_38 = pCtx;
    jx9_value_int(pVal,iValue);
    jx9_array_add_strkey_elem(pArray,"seconds",pVal);
    jx9_value_int(pVal,iValue_00);
    jx9_array_add_strkey_elem(pArray,"minutes",pVal);
    jx9_value_int(pVal,iVar1);
    jx9_array_add_strkey_elem(pArray,"hours",pVal);
    jx9_value_int(pVal,iValue_01);
    jx9_array_add_strkey_elem(pArray,"mday",pVal);
    jx9_value_int(pVal,iValue_03);
    jx9_array_add_strkey_elem(pArray,"wday",pVal);
    uVar3 = local_40;
    iVar1 = (int)local_40;
    jx9_value_int(pVal,iVar1 + 1);
    jx9_array_add_strkey_elem(pArray,"mon",pVal);
    jx9_value_int(pVal,iVar2 + 0x76c);
    jx9_array_add_strkey_elem(pArray,"year",pVal);
    jx9_value_int(pVal,iValue_02);
    jx9_array_add_strkey_elem(pArray,"yday",pVal);
    jx9_value_string(pVal,zEngDay[iValue_03 % 7],-1);
    jx9_array_add_strkey_elem(pArray,"weekday",pVal);
    SyBlobReset(&pVal->sBlob);
    jx9_value_string(pVal,zEngMonth[(int)((long)((ulong)(uint)(iVar1 >> 0x1f) << 0x20 |
                                                uVar3 & 0xffffffff) % 0xc)],-1);
    jx9_array_add_strkey_elem(pArray,"month",pVal);
    iValue_04 = time((time_t *)0x0);
    jx9_value_int64(pVal,iValue_04);
    jx9_array_add_elem(pArray,(jx9_value *)0x0,pVal);
    jx9_result_value(local_38,pArray);
  }
  return 0;
}

Assistant:

static int jx9Builtin_getdate(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pValue, *pArray;
	Sytm sTm;
	if( nArg < 1 ){
#ifdef __WINNT__
		SYSTEMTIME sOS;
		GetSystemTime(&sOS);
		SYSTEMTIME_TO_SYTM(&sOS, &sTm);
#else
		struct tm *pTm;
		time_t t;
		time(&t);
		pTm = localtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
#endif
	}else{
		/* Use the given timestamp */
		time_t t;
		struct tm *pTm;
#ifdef __WINNT__
#ifdef _MSC_VER
#if _MSC_VER >= 1400 /* Visual Studio 2005 and up */
#pragma warning(disable:4996) /* _CRT_SECURE...*/
#endif
#endif
#endif
		if( jx9_value_is_int(apArg[0]) ){
			t = (time_t)jx9_value_to_int64(apArg[0]);
			pTm = localtime(&t);
			if( pTm == 0 ){
				time(&t);
			}
		}else{
			time(&t);
		}
		pTm = localtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
	}
	/* Element value */
	pValue = jx9_context_new_scalar(pCtx);
	if( pValue == 0 ){
		/* Return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Create a new array */
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		/* Return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Fill the array */
	/* Seconds */
	jx9_value_int(pValue, sTm.tm_sec);
	jx9_array_add_strkey_elem(pArray, "seconds", pValue);
	/* Minutes */
	jx9_value_int(pValue, sTm.tm_min);
	jx9_array_add_strkey_elem(pArray, "minutes", pValue);
	/* Hours */
	jx9_value_int(pValue, sTm.tm_hour);
	jx9_array_add_strkey_elem(pArray, "hours", pValue);
	/* mday */
	jx9_value_int(pValue, sTm.tm_mday);
	jx9_array_add_strkey_elem(pArray, "mday", pValue);
	/* wday */
	jx9_value_int(pValue, sTm.tm_wday);
	jx9_array_add_strkey_elem(pArray, "wday", pValue);
	/* mon */
	jx9_value_int(pValue, sTm.tm_mon+1);
	jx9_array_add_strkey_elem(pArray, "mon", pValue);
	/* year */
	jx9_value_int(pValue, sTm.tm_year);
	jx9_array_add_strkey_elem(pArray, "year", pValue);
	/* yday */
	jx9_value_int(pValue, sTm.tm_yday);
	jx9_array_add_strkey_elem(pArray, "yday", pValue);
	/* Weekday */
	jx9_value_string(pValue, SyTimeGetDay(sTm.tm_wday), -1);
	jx9_array_add_strkey_elem(pArray, "weekday", pValue);
	/* Month */
	jx9_value_reset_string_cursor(pValue);
	jx9_value_string(pValue, SyTimeGetMonth(sTm.tm_mon), -1);
	jx9_array_add_strkey_elem(pArray, "month", pValue);
	/* Seconds since the epoch */
	jx9_value_int64(pValue, (jx9_int64)time(0));
	jx9_array_add_elem(pArray, 0 /* Index zero */, pValue);
	/* Return the freshly created array */
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}